

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_times.c
# Opt level: O3

void ngx_time_update(void)

{
  u_char (*buf) [20];
  long lVar1;
  ngx_uint_t nVar2;
  u_char (*buf_00) [27];
  ngx_uint_t nVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  u_char (*buf_01) [26];
  long lVar7;
  u_char (*buf_02) [16];
  undefined1 local_d8 [8];
  ngx_tm_t tm;
  ngx_tm_t gmt;
  timeval tv;
  
  if (ngx_time_lock != 0) {
    return;
  }
  LOCK();
  ngx_time_lock = 1;
  UNLOCK();
  gettimeofday((timeval *)&gmt.tm_zone,(__timezone_ptr_t)0x0);
  nVar2 = tv.tv_sec / 1000;
  ngx_current_msec = (long)gmt.tm_zone * 1000 + nVar2;
  if ((char *)cached_time[slot].sec == gmt.tm_zone) {
    cached_time[slot].msec = nVar2;
  }
  else {
    nVar3 = 0;
    if (slot != 0x3f) {
      nVar3 = slot + 1;
    }
    slot = nVar3;
    cached_time[nVar3].sec = (time_t)gmt.tm_zone;
    cached_time[nVar3].msec = nVar2;
    ngx_gmtime((time_t)gmt.tm_zone,(ngx_tm_t *)&tm.tm_zone);
    ngx_sprintf(cached_http_time[nVar3],"%s, %02d %s %4d %02d:%02d:%02d GMT",week[gmt.tm_mon],
                (ulong)(uint)gmt.tm_min,*(undefined8 *)(&DAT_001b9ee8 + (long)gmt.tm_hour * 8),
                (ulong)(uint)gmt.tm_mday,(ulong)(uint)gmt.tm_sec,(ulong)tm.tm_zone._4_4_,
                (ulong)(uint)tm.tm_zone);
    ngx_localtime((time_t)gmt.tm_zone,(ngx_tm_t *)local_d8);
    cached_gmtoff = (long)tm._32_8_ / 0x3c;
    cached_time[nVar3].gmtoff = cached_gmtoff;
    buf = cached_err_log_time + slot;
    uVar6 = (ulong)(uint)local_d8._0_4_;
    ngx_sprintf(*buf,"%4d/%02d/%02d %02d:%02d:%02d",(ulong)(uint)tm.tm_mday,(ulong)(uint)tm.tm_hour,
                (ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,(ulong)(uint)local_d8._4_4_,uVar6);
    buf_00 = cached_http_log_time + slot;
    lVar1 = cached_time[nVar3].gmtoff;
    lVar4 = -(lVar1 / 0x3c);
    if (-0x3c < lVar1) {
      lVar4 = lVar1 / 0x3c;
    }
    lVar5 = lVar1 % 0x3c;
    lVar7 = -lVar5;
    if (0 < lVar5) {
      lVar7 = lVar5;
    }
    ngx_sprintf(*buf_00,"%02d/%s/%d:%02d:%02d:%02d %c%02i%02i",tm.tm_min,
                *(undefined8 *)(&DAT_001b9ee8 + (long)tm.tm_hour * 8),(ulong)(uint)tm.tm_mday,
                (ulong)(uint)tm.tm_sec,(ulong)(uint)local_d8._4_4_,(ulong)(uint)local_d8._0_4_,
                (ulong)((int)(lVar1 >> 0x3f) * -2 + 0x2b),lVar4,lVar7);
    buf_01 = cached_http_log_iso8601 + slot;
    lVar1 = cached_time[nVar3].gmtoff;
    lVar4 = -(lVar1 / 0x3c);
    if (-0x3c < lVar1) {
      lVar4 = lVar1 / 0x3c;
    }
    lVar5 = lVar1 % 0x3c;
    lVar7 = -lVar5;
    if (0 < lVar5) {
      lVar7 = lVar5;
    }
    ngx_sprintf(*buf_01,"%4d-%02d-%02dT%02d:%02d:%02d%c%02i:%02i",(ulong)(uint)tm.tm_mday,
                (ulong)(uint)tm.tm_hour,(ulong)(uint)tm.tm_min,(ulong)(uint)tm.tm_sec,
                (ulong)(uint)local_d8._4_4_,(ulong)(uint)local_d8._0_4_,
                (ulong)((int)(lVar1 >> 0x3f) * -2 + 0x2b),lVar4,lVar7);
    buf_02 = cached_syslog_time + slot;
    ngx_sprintf(*buf_02,"%s %2d %02d:%02d:%02d",
                *(undefined8 *)(&DAT_001b9ee8 + (long)tm.tm_hour * 8),(ulong)(uint)tm.tm_min,
                (ulong)(uint)tm.tm_sec,(ulong)(uint)local_d8._4_4_,(ulong)(uint)local_d8._0_4_,uVar6
               );
    ngx_cached_err_log_time.data = *buf;
    ngx_cached_http_time.data = cached_http_time[nVar3];
    ngx_cached_http_log_time.data = *buf_00;
    ngx_cached_http_log_iso8601.data = *buf_01;
    ngx_cached_syslog_time.data = *buf_02;
    ngx_cached_time = cached_time + nVar3;
  }
  ngx_time_lock = 0;
  return;
}

Assistant:

void
ngx_time_update(void)
{
    u_char          *p0, *p1, *p2, *p3, *p4;
    ngx_tm_t         tm, gmt;
    time_t           sec;
    ngx_uint_t       msec;
    ngx_time_t      *tp;
    struct timeval   tv;

    if (!ngx_trylock(&ngx_time_lock)) {
        return;
    }

    ngx_gettimeofday(&tv);

    sec = tv.tv_sec;
    msec = tv.tv_usec / 1000;

    ngx_current_msec = (ngx_msec_t) sec * 1000 + msec;

    tp = &cached_time[slot];

    if (tp->sec == sec) {
        tp->msec = msec;
        ngx_unlock(&ngx_time_lock);
        return;
    }

    if (slot == NGX_TIME_SLOTS - 1) {
        slot = 0;
    } else {
        slot++;
    }

    tp = &cached_time[slot];

    tp->sec = sec;
    tp->msec = msec;

    ngx_gmtime(sec, &gmt);


    p0 = &cached_http_time[slot][0];

    (void) ngx_sprintf(p0, "%s, %02d %s %4d %02d:%02d:%02d GMT",
                       week[gmt.ngx_tm_wday], gmt.ngx_tm_mday,
                       months[gmt.ngx_tm_mon - 1], gmt.ngx_tm_year,
                       gmt.ngx_tm_hour, gmt.ngx_tm_min, gmt.ngx_tm_sec);

#if (NGX_HAVE_GETTIMEZONE)

    tp->gmtoff = ngx_gettimezone();
    ngx_gmtime(sec + tp->gmtoff * 60, &tm);

#elif (NGX_HAVE_GMTOFF)

    ngx_localtime(sec, &tm);
    cached_gmtoff = (ngx_int_t) (tm.ngx_tm_gmtoff / 60);
    tp->gmtoff = cached_gmtoff;

#else

    ngx_localtime(sec, &tm);
    cached_gmtoff = ngx_timezone(tm.ngx_tm_isdst);
    tp->gmtoff = cached_gmtoff;

#endif


    p1 = &cached_err_log_time[slot][0];

    (void) ngx_sprintf(p1, "%4d/%02d/%02d %02d:%02d:%02d",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec);


    p2 = &cached_http_log_time[slot][0];

    (void) ngx_sprintf(p2, "%02d/%s/%d:%02d:%02d:%02d %c%02i%02i",
                       tm.ngx_tm_mday, months[tm.ngx_tm_mon - 1],
                       tm.ngx_tm_year, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec,
                       tp->gmtoff < 0 ? '-' : '+',
                       ngx_abs(tp->gmtoff / 60), ngx_abs(tp->gmtoff % 60));

    p3 = &cached_http_log_iso8601[slot][0];

    (void) ngx_sprintf(p3, "%4d-%02d-%02dT%02d:%02d:%02d%c%02i:%02i",
                       tm.ngx_tm_year, tm.ngx_tm_mon,
                       tm.ngx_tm_mday, tm.ngx_tm_hour,
                       tm.ngx_tm_min, tm.ngx_tm_sec,
                       tp->gmtoff < 0 ? '-' : '+',
                       ngx_abs(tp->gmtoff / 60), ngx_abs(tp->gmtoff % 60));

    p4 = &cached_syslog_time[slot][0];

    (void) ngx_sprintf(p4, "%s %2d %02d:%02d:%02d",
                       months[tm.ngx_tm_mon - 1], tm.ngx_tm_mday,
                       tm.ngx_tm_hour, tm.ngx_tm_min, tm.ngx_tm_sec);

    ngx_memory_barrier();

    ngx_cached_time = tp;
    ngx_cached_http_time.data = p0;
    ngx_cached_err_log_time.data = p1;
    ngx_cached_http_log_time.data = p2;
    ngx_cached_http_log_iso8601.data = p3;
    ngx_cached_syslog_time.data = p4;

    ngx_unlock(&ngx_time_lock);
}